

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall mock_visitor<bool>::mock_visitor(mock_visitor<bool> *this)

{
  MockSpec<test_result_(bool)> *this_00;
  OnCallSpec<test_result_(bool)> *this_01;
  linked_ptr<testing::ActionInterface<test_result_(bool)>_> local_40;
  MatcherBase<bool> local_30;
  
  testing::internal::FunctionMocker<test_result_(bool)>::FunctionMocker(&this->gmock1_visit_268);
  testing::internal::FunctionMocker<void_()>::FunctionMocker(&this->gmock0_unexpected_269);
  testing::A<bool>();
  this_00 = gmock_visit(this,(Matcher<bool> *)&local_30);
  this_01 = testing::internal::MockSpec<test_result_(bool)>::InternalDefaultActionSetAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
                       ,0x109,"*this","visit(_)");
  local_40.value_ = (ActionInterface<test_result_(bool)> *)operator_new(0x10);
  (local_40.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001b7a28;
  local_40.link_.next_ = &local_40.link_;
  testing::internal::OnCallSpec<test_result_(bool)>::WillByDefault
            (this_01,(Action<test_result_(bool)> *)&local_40);
  testing::internal::linked_ptr<testing::ActionInterface<test_result_(bool)>_>::~linked_ptr
            (&local_40);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_30);
  return;
}

Assistant:

mock_visitor() {
    ON_CALL(*this, visit(_)).WillByDefault(testing::Return(test_result()));
  }